

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

Emitter * __thiscall YAML::Emitter::Write(Emitter *this,_Alias *alias)

{
  _Head_base<0UL,_YAML::EmitterState_*,_false> _Var1;
  bool bVar2;
  allocator local_39;
  string local_38;
  
  _Var1._M_head_impl =
       (this->m_pState)._M_t.
       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
       super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->m_isGood == true) {
    if (((_Var1._M_head_impl)->m_hasAnchor == false) && ((_Var1._M_head_impl)->m_hasTag != true)) {
      PrepareNode(this,Scalar);
      bVar2 = Utils::WriteAlias(&this->m_stream,&alias->content);
      if (bVar2) {
        StartedScalar(this);
        EmitterState::SetAlias
                  ((this->m_pState)._M_t.
                   super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                   .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl);
        return this;
      }
      _Var1._M_head_impl =
           (this->m_pState)._M_t.
           super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
           super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
           super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
      std::__cxx11::string::string((string *)&local_38,"invalid alias",&local_39);
      EmitterState::SetError(_Var1._M_head_impl,&local_38);
    }
    else {
      std::__cxx11::string::string((string *)&local_38,"invalid alias",&local_39);
      EmitterState::SetError(_Var1._M_head_impl,&local_38);
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  return this;
}

Assistant:

Emitter& Emitter::Write(const _Alias& alias) {
  if (!good())
    return *this;

  if (m_pState->HasAnchor() || m_pState->HasTag()) {
    m_pState->SetError(ErrorMsg::INVALID_ALIAS);
    return *this;
  }

  PrepareNode(EmitterNodeType::Scalar);

  if (!Utils::WriteAlias(m_stream, alias.content)) {
    m_pState->SetError(ErrorMsg::INVALID_ALIAS);
    return *this;
  }

  StartedScalar();

  m_pState->SetAlias();

  return *this;
}